

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::deinit(TextureCubeArrayFilteringCase *this)

{
  TextureCubeArray *pTVar1;
  TextureCubeArrayFilteringCase *this_local;
  
  pTVar1 = this->m_gradientTex;
  if (pTVar1 != (TextureCubeArray *)0x0) {
    glu::TextureCubeArray::~TextureCubeArray(pTVar1);
    operator_delete(pTVar1,0x68);
  }
  pTVar1 = this->m_gridTex;
  if (pTVar1 != (TextureCubeArray *)0x0) {
    glu::TextureCubeArray::~TextureCubeArray(pTVar1);
    operator_delete(pTVar1,0x68);
  }
  this->m_gradientTex = (TextureCubeArray *)0x0;
  this->m_gridTex = (TextureCubeArray *)0x0;
  gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  std::
  vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  ::clear(&this->m_cases);
  return;
}

Assistant:

void TextureCubeArrayFilteringCase::deinit (void)
{
	delete m_gradientTex;
	delete m_gridTex;

	m_gradientTex	= DE_NULL;
	m_gridTex		= DE_NULL;

	m_renderer.clear();
	m_cases.clear();
}